

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unames.cpp
# Opt level: O2

uint8_t * icu_63::expandGroupLengths(uint8_t *s,uint16_t *offsets,uint16_t *lengths)

{
  ushort uVar1;
  uint16_t *puVar2;
  ushort uVar3;
  uint16_t *puVar4;
  uint16_t uVar5;
  byte bVar6;
  uint16_t uVar7;
  ushort uVar8;
  
  uVar5 = 0;
  uVar8 = 0;
  uVar1 = 0;
  do {
    uVar3 = uVar1;
    puVar4 = offsets;
    puVar2 = lengths;
    if (0x1f < uVar3) {
      return s;
    }
    bVar6 = *s;
    if (uVar8 < 0xc) {
      if (bVar6 < 0xc0) {
        uVar7 = (uint16_t)(bVar6 >> 4);
        goto LAB_0033e9ea;
      }
      uVar7 = (bVar6 & 0x3f) + 0xc;
    }
    else {
      uVar7 = (uVar8 & 3) * 0x10 + (ushort)(bVar6 >> 4) + 0xc;
LAB_0033e9ea:
      bVar6 = bVar6 & 0xf;
    }
    s = s + 1;
    *puVar4 = uVar5;
    *puVar2 = uVar7;
    uVar5 = uVar7 + uVar5;
    uVar8 = 0;
    lengths = puVar2 + 1;
    offsets = puVar4 + 1;
    uVar1 = uVar3 + 1;
    if ((bVar6 < 0x10) && (uVar8 = (ushort)bVar6, bVar6 < 0xc)) {
      puVar4[1] = uVar5;
      puVar2[1] = (ushort)bVar6;
      uVar5 = bVar6 + uVar5;
      lengths = puVar2 + 2;
      offsets = puVar4 + 2;
      uVar1 = uVar3 + 2;
    }
  } while( true );
}

Assistant:

static const uint8_t *
expandGroupLengths(const uint8_t *s,
                   uint16_t offsets[LINES_PER_GROUP+1], uint16_t lengths[LINES_PER_GROUP+1]) {
    /* read the lengths of the 32 strings in this group and get each string's offset */
    uint16_t i=0, offset=0, length=0;
    uint8_t lengthByte;

    /* all 32 lengths must be read to get the offset of the first group string */
    while(i<LINES_PER_GROUP) {
        lengthByte=*s++;

        /* read even nibble - MSBs of lengthByte */
        if(length>=12) {
            /* double-nibble length spread across two bytes */
            length=(uint16_t)(((length&0x3)<<4|lengthByte>>4)+12);
            lengthByte&=0xf;
        } else if((lengthByte /* &0xf0 */)>=0xc0) {
            /* double-nibble length spread across this one byte */
            length=(uint16_t)((lengthByte&0x3f)+12);
        } else {
            /* single-nibble length in MSBs */
            length=(uint16_t)(lengthByte>>4);
            lengthByte&=0xf;
        }

        *offsets++=offset;
        *lengths++=length;

        offset+=length;
        ++i;

        /* read odd nibble - LSBs of lengthByte */
        if((lengthByte&0xf0)==0) {
            /* this nibble was not consumed for a double-nibble length above */
            length=lengthByte;
            if(length<12) {
                /* single-nibble length in LSBs */
                *offsets++=offset;
                *lengths++=length;

                offset+=length;
                ++i;
            }
        } else {
            length=0;   /* prevent double-nibble detection in the next iteration */
        }
    }

    /* now, s is at the first group string */
    return s;
}